

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CLI11.hpp
# Opt level: O0

void __thiscall
CLI::App::parse(App *this,
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *args)

{
  long in_RDI;
  App *in_stack_00000030;
  bool in_stack_0000005e;
  bool in_stack_0000005f;
  App *in_stack_00000060;
  App *in_stack_00000100;
  
  if (*(int *)(in_RDI + 0x2e4) != 0) {
    clear(in_stack_00000030);
  }
  *(undefined4 *)(in_RDI + 0x2e4) = 1;
  _validate(in_stack_00000100);
  _configure(this);
  *(undefined8 *)(in_RDI + 0x308) = 0;
  *(undefined4 *)(in_RDI + 0x2e4) = 0;
  _parse(this,args);
  run_callback(in_stack_00000060,in_stack_0000005f,in_stack_0000005e);
  return;
}

Assistant:

CLI11_INLINE void App::parse(std::vector<std::string> &args) {
    // Clear if parsed
    if(parsed_ > 0)
        clear();

    // parsed_ is incremented in commands/subcommands,
    // but placed here to make sure this is cleared when
    // running parse after an error is thrown, even by _validate or _configure.
    parsed_ = 1;
    _validate();
    _configure();
    // set the parent as nullptr as this object should be the top now
    parent_ = nullptr;
    parsed_ = 0;

    _parse(args);
    run_callback();
}